

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall cereal::JSONInputArchive::Iterator::search(Iterator *this,char *searchName)

{
  bool bVar1;
  int iVar2;
  size_t __n;
  Pointer this_00;
  size_t sVar3;
  Exception *this_01;
  allocator<char> local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  char *local_38;
  Ch *currentName;
  MemberIterator it;
  size_t index;
  size_t len;
  char *searchName_local;
  Iterator *this_local;
  
  __n = strlen(searchName);
  it.ptr_ = (Pointer)0x0;
  currentName = (Ch *)(this->itsMemberItBegin).ptr_;
  do {
    bVar1 = rapidjson::
            GenericMemberIterator<true,rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator!=((GenericMemberIterator<true,rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)&currentName,&this->itsMemberItEnd);
    if (!bVar1) {
      this_01 = (Exception *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,searchName,&local_99);
      std::operator+(&local_78,"JSON Parsing failed - provided NVP (",&local_98);
      std::operator+(&local_58,&local_78,") not found");
      Exception::Exception(this_01,&local_58);
      __cxa_throw(this_01,&Exception::typeinfo,Exception::~Exception);
    }
    this_00 = rapidjson::
              GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::operator->((GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)&currentName);
    local_38 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(&this_00->name);
    iVar2 = strncmp(searchName,local_38,__n);
    if (iVar2 == 0) {
      sVar3 = strlen(local_38);
      if (sVar3 == __n) {
        this->itsIndex = (size_t)it.ptr_;
        return;
      }
    }
    rapidjson::
    GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
    ::operator++((GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&currentName);
    it.ptr_ = (Pointer)((long)&((it.ptr_)->name).data_ + 1);
  } while( true );
}

Assistant:

inline void search( const char * searchName )
          {
            const auto len = std::strlen( searchName );
            size_t index = 0;
            for( auto it = itsMemberItBegin; it != itsMemberItEnd; ++it, ++index )
            {
              const auto currentName = it->name.GetString();
              if( ( std::strncmp( searchName, currentName, len ) == 0 ) &&
                  ( std::strlen( currentName ) == len ) )
              {
                itsIndex = index;
                return;
              }
            }

            throw Exception("JSON Parsing failed - provided NVP (" + std::string(searchName) + ") not found");
          }